

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_extension.c
# Opt level: O0

void dlep_extension_add_processing
               (dlep_extension *ext,_Bool radio,dlep_extension_implementation *processing,
               size_t proc_count)

{
  ulong local_38;
  size_t j;
  size_t i;
  size_t proc_count_local;
  dlep_extension_implementation *processing_local;
  _Bool radio_local;
  dlep_extension *ext_local;
  
  local_38 = 0;
  do {
    if (proc_count <= local_38) {
      return;
    }
    for (j = 0; j < ext->signal_count; j = j + 1) {
      if (ext->signals[j].id == processing[local_38].id) {
        if (radio) {
          ext->signals[j].process_radio = processing[local_38].process;
          ext->signals[j].add_radio_tlvs = processing[local_38].add_tlvs;
        }
        else {
          ext->signals[j].process_router = processing[local_38].process;
          ext->signals[j].add_router_tlvs = processing[local_38].add_tlvs;
        }
        break;
      }
    }
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

void
dlep_extension_add_processing(
  struct dlep_extension *ext, bool radio, struct dlep_extension_implementation *processing, size_t proc_count) {
  size_t i, j;

  for (j = 0; j < proc_count; j++) {
    for (i = 0; i < ext->signal_count; i++) {
      if (ext->signals[i].id == processing[j].id) {
        if (radio) {
          ext->signals[i].process_radio = processing[j].process;
          ext->signals[i].add_radio_tlvs = processing[j].add_tlvs;
        }
        else {
          ext->signals[i].process_router = processing[j].process;
          ext->signals[i].add_router_tlvs = processing[j].add_tlvs;
        }
        break;
      }
    }
  }
}